

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testUTF8Chunks(void)

{
  int iVar1;
  long lVar2;
  uint local_30;
  uint local_2c;
  int ret;
  int i;
  char *buf;
  char *pcStack_18;
  int outSize;
  xmlChar *out;
  xmlParserCtxtPtr ctxt;
  
  out = (xmlChar *)xmlCreatePushParserCtxt(0,0,0,0);
  xmlParseChunk(out,"<d>",3,0);
  xmlParseChunk(out,anon_var_dwarf_335,1,0);
  xmlParseChunk(out,anon_var_dwarf_34c,1,0);
  xmlParseChunk(out,anon_var_dwarf_357,1,0);
  xmlParseChunk(out,anon_var_dwarf_362,1,0);
  xmlParseChunk(out,anon_var_dwarf_39a + 1,4,1);
  xmlDocDumpMemory(*(undefined8 *)(out + 0x10),&stack0xffffffffffffffe8,(long)&buf + 4);
  iVar1 = strcmp(pcStack_18,"<?xml version=\"1.0\"?>\n<d>&#x1F60A;</d>\n");
  if (iVar1 != 0) {
    fprintf(_stderr,"failed UTF-8 chunk test 1\n");
  }
  local_30 = (uint)(iVar1 != 0);
  (*_xmlFree)(pcStack_18);
  xmlFreeDoc(*(undefined8 *)(out + 0x10));
  xmlFreeParserCtxt(out);
  out = (xmlChar *)xmlCreatePushParserCtxt(0,0,0,0);
  xmlParseChunk(out,"<d>",3,0);
  lVar2 = (*_xmlMalloc)(0x7d1);
  for (local_2c = 0; (int)local_2c < 2000; local_2c = local_2c + 2) {
    *(undefined2 *)(lVar2 + (int)local_2c) = 0xb1ce;
  }
  *(undefined1 *)(lVar2 + (int)local_2c) = 0xce;
  xmlParseChunk(out,lVar2,0x7d1,0);
  (*_xmlFree)(lVar2);
  xmlParseChunk(out,anon_var_dwarf_39a,4,0);
  xmlParseChunk(out,0,0);
  xmlDocDumpMemory(*(undefined8 *)(out + 0x10),&stack0xffffffffffffffe8,(long)&buf + 4);
  iVar1 = strncmp(pcStack_18,"<?xml version=\"1.0\"?>\n<d>",0x19);
  if (iVar1 == 0) {
    for (local_2c = 0x19; (int)local_2c < 0x1b78; local_2c = local_2c + 7) {
      iVar1 = memcmp(pcStack_18 + (int)local_2c,"&#x3B1;",7);
      if (iVar1 != 0) {
        fprintf(_stderr,"failed UTF-8 chunk test 2-2 %d\n",(ulong)local_2c);
        local_30 = local_30 + 1;
        goto LAB_00103118;
      }
    }
    iVar1 = strcmp(pcStack_18 + (int)local_2c,"</d>\n");
    if (iVar1 != 0) {
      fprintf(_stderr,"failed UTF-8 chunk test 2-3\n");
      local_30 = local_30 + 1;
    }
  }
  else {
    fprintf(_stderr,"failed UTF-8 chunk test 2-1\n");
    local_30 = local_30 + 1;
  }
LAB_00103118:
  (*_xmlFree)(pcStack_18);
  xmlFreeDoc(*(undefined8 *)(out + 0x10));
  xmlFreeParserCtxt(out);
  return local_30;
}

Assistant:

static int
testUTF8Chunks(void) {
    xmlParserCtxtPtr ctxt;
    xmlChar *out;
    int outSize;
    char *buf;
    int i;
    int ret = 0;

    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0, NULL);

    xmlParseChunk(ctxt, "<d>", 3, 0);
    xmlParseChunk(ctxt, "\xF0", 1, 0);
    xmlParseChunk(ctxt, "\x9F", 1, 0);
    xmlParseChunk(ctxt, "\x98", 1, 0);
    xmlParseChunk(ctxt, "\x8A", 1, 0);
    xmlParseChunk(ctxt, "</d>", 4, 1);

    xmlDocDumpMemory(ctxt->myDoc, &out, &outSize);
    if (strcmp((char *) out,
               "<?xml version=\"1.0\"?>\n<d>&#x1F60A;</d>\n") != 0) {
        fprintf(stderr, "failed UTF-8 chunk test 1\n");
        ret += 1;
    }

    xmlFree(out);
    xmlFreeDoc(ctxt->myDoc);
    xmlFreeParserCtxt(ctxt);

    ctxt = xmlCreatePushParserCtxt(NULL, NULL, NULL, 0, NULL);

    xmlParseChunk(ctxt, "<d>", 3, 0);

    /*
     * Create a chunk longer than XML_PARSER_BIG_BUFFER_SIZE (300) ending
     * with an incomplete UTF-8 sequence.
     */
    buf = xmlMalloc(1000 * 2 + 1);
    for (i = 0; i < 2000; i += 2)
        memcpy(buf + i, "\xCE\xB1", 2);
    buf[i] = '\xCE';
    xmlParseChunk(ctxt, buf, 2001, 0);
    xmlFree(buf);

    xmlParseChunk(ctxt, "\xB1</d>", 4, 0);
    xmlParseChunk(ctxt, NULL, 0, 0);

    xmlDocDumpMemory(ctxt->myDoc, &out, &outSize);
    if (strncmp((char *) out, "<?xml version=\"1.0\"?>\n<d>", 25) != 0) {
        fprintf(stderr, "failed UTF-8 chunk test 2-1\n");
        ret += 1;
        goto error;
    }
    for (i = 25; i < 25 + 1001 * 7; i += 7) {
        if (memcmp(out + i, "&#x3B1;", 7) != 0) {
            fprintf(stderr, "failed UTF-8 chunk test 2-2 %d\n", i);
            ret += 1;
            goto error;
        }
    }
    if (strcmp((char *) out + i, "</d>\n") != 0) {
        fprintf(stderr, "failed UTF-8 chunk test 2-3\n");
        ret += 1;
        goto error;
    }

error:
    xmlFree(out);
    xmlFreeDoc(ctxt->myDoc);
    xmlFreeParserCtxt(ctxt);

    return(ret);
    return(0);
}